

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load-balance-collective.hpp
# Opt level: O1

void diy::detail::decide_move_info
               (vector<diy::detail::WorkInfo,_std::allocator<diy::detail::WorkInfo>_> *all_work_info
               ,vector<diy::detail::MoveInfo,_std::allocator<diy::detail::MoveInfo>_> *all_move_info
               )

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  pointer pMVar5;
  iterator __position;
  undefined4 uVar6;
  undefined4 uVar7;
  uint uVar8;
  ulong uVar9;
  pointer pWVar10;
  long lVar11;
  ulong uVar12;
  pointer pWVar13;
  anon_class_1_0_00000001 cmp;
  value_type work_info;
  MoveInfo move_info;
  priority_queue<diy::detail::WorkInfo,_std::vector<diy::detail::WorkInfo,_std::allocator<diy::detail::WorkInfo>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_diatomic[P]diy_include_diy_detail_algorithms_load_balance_collective_hpp:34:16)>
  min_proc_work_q;
  anon_class_1_0_00000001 local_89;
  vector<diy::detail::WorkInfo,_std::allocator<diy::detail::WorkInfo>_> local_88;
  MoveInfo local_64;
  priority_queue<diy::detail::WorkInfo,_std::vector<diy::detail::WorkInfo,_std::allocator<diy::detail::WorkInfo>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_diatomic[P]diy_include_diy_detail_algorithms_load_balance_collective_hpp:34:16)>
  local_58;
  vector<diy::detail::MoveInfo,std::allocator<diy::detail::MoveInfo>> *local_38;
  
  pMVar5 = (all_move_info->
           super__Vector_base<diy::detail::MoveInfo,_std::allocator<diy::detail::MoveInfo>_>).
           _M_impl.super__Vector_impl_data._M_start;
  if ((all_move_info->
      super__Vector_base<diy::detail::MoveInfo,_std::allocator<diy::detail::MoveInfo>_>)._M_impl.
      super__Vector_impl_data._M_finish != pMVar5) {
    (all_move_info->
    super__Vector_base<diy::detail::MoveInfo,_std::allocator<diy::detail::MoveInfo>_>)._M_impl.
    super__Vector_impl_data._M_finish = pMVar5;
  }
  local_88.super__Vector_base<diy::detail::WorkInfo,_std::allocator<diy::detail::WorkInfo>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.super__Vector_base<diy::detail::WorkInfo,_std::allocator<diy::detail::WorkInfo>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.super__Vector_base<diy::detail::WorkInfo,_std::allocator<diy::detail::WorkInfo>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Catch::clara::std::
  priority_queue<diy::detail::WorkInfo,_std::vector<diy::detail::WorkInfo,_std::allocator<diy::detail::WorkInfo>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/detail/algorithms/load-balance-collective.hpp:34:16)>
  ::priority_queue(&local_58,&local_89,&local_88);
  if (local_88.super__Vector_base<diy::detail::WorkInfo,_std::allocator<diy::detail::WorkInfo>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.
                    super__Vector_base<diy::detail::WorkInfo,_std::allocator<diy::detail::WorkInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_88.
                          super__Vector_base<diy::detail::WorkInfo,_std::allocator<diy::detail::WorkInfo>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.
                          super__Vector_base<diy::detail::WorkInfo,_std::allocator<diy::detail::WorkInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  pWVar10 = (all_work_info->
            super__Vector_base<diy::detail::WorkInfo,_std::allocator<diy::detail::WorkInfo>_>).
            _M_impl.super__Vector_impl_data._M_start;
  pWVar13 = (all_work_info->
            super__Vector_base<diy::detail::WorkInfo,_std::allocator<diy::detail::WorkInfo>_>).
            _M_impl.super__Vector_impl_data._M_finish;
  local_38 = (vector<diy::detail::MoveInfo,std::allocator<diy::detail::MoveInfo>> *)all_move_info;
  if (pWVar13 == pWVar10) {
    uVar9 = 0;
  }
  else {
    lVar11 = 0;
    uVar12 = 0;
    do {
      Catch::clara::std::
      priority_queue<diy::detail::WorkInfo,_std::vector<diy::detail::WorkInfo,_std::allocator<diy::detail::WorkInfo>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/detail/algorithms/load-balance-collective.hpp:34:16)>
      ::push(&local_58,(value_type *)((long)&pWVar10->proc_rank + lVar11));
      uVar12 = uVar12 + 1;
      pWVar10 = (all_work_info->
                super__Vector_base<diy::detail::WorkInfo,_std::allocator<diy::detail::WorkInfo>_>).
                _M_impl.super__Vector_impl_data._M_start;
      pWVar13 = (all_work_info->
                super__Vector_base<diy::detail::WorkInfo,_std::allocator<diy::detail::WorkInfo>_>).
                _M_impl.super__Vector_impl_data._M_finish;
      uVar9 = ((long)pWVar13 - (long)pWVar10 >> 2) * -0x3333333333333333;
      lVar11 = lVar11 + 0x14;
    } while (uVar12 <= uVar9 && uVar9 - uVar12 != 0);
  }
  if (pWVar10 != pWVar13) {
    lVar11 = 0x3f;
    if (uVar9 != 0) {
      for (; uVar9 >> lVar11 == 0; lVar11 = lVar11 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<diy::detail::WorkInfo*,std::vector<diy::detail::WorkInfo,std::allocator<diy::detail::WorkInfo>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<diy::detail::decide_move_info(std::vector<diy::detail::WorkInfo,std::allocator<diy::detail::WorkInfo>>&,std::vector<diy::detail::MoveInfo,std::allocator<diy::detail::MoveInfo>>&)::_lambda(diy::detail::WorkInfo&,diy::detail::WorkInfo&)_2_>>
              (pWVar10,pWVar13,((uint)lVar11 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<diy::detail::WorkInfo*,std::vector<diy::detail::WorkInfo,std::allocator<diy::detail::WorkInfo>>>,__gnu_cxx::__ops::_Iter_comp_iter<diy::detail::decide_move_info(std::vector<diy::detail::WorkInfo,std::allocator<diy::detail::WorkInfo>>&,std::vector<diy::detail::MoveInfo,std::allocator<diy::detail::MoveInfo>>&)::_lambda(diy::detail::WorkInfo&,diy::detail::WorkInfo&)_2_>>
              (pWVar10,pWVar13);
  }
  pWVar10 = (all_work_info->
            super__Vector_base<diy::detail::WorkInfo,_std::allocator<diy::detail::WorkInfo>_>).
            _M_impl.super__Vector_impl_data._M_start;
  if ((all_work_info->
      super__Vector_base<diy::detail::WorkInfo,_std::allocator<diy::detail::WorkInfo>_>)._M_impl.
      super__Vector_impl_data._M_finish != pWVar10) {
    lVar11 = 0x10;
    uVar9 = 0;
    do {
      uVar1 = *(uint *)((long)pWVar10 + lVar11 + -8);
      if (uVar1 < *(int *)((long)pWVar10 + lVar11 + -4) -
                  (local_58.c.
                   super__Vector_base<diy::detail::WorkInfo,_std::allocator<diy::detail::WorkInfo>_>
                   ._M_impl.super__Vector_impl_data._M_start)->proc_work) {
        iVar2 = *(int *)((long)pWVar10 + lVar11 + -0x10);
        iVar3 = (local_58.c.
                 super__Vector_base<diy::detail::WorkInfo,_std::allocator<diy::detail::WorkInfo>_>.
                 _M_impl.super__Vector_impl_data._M_start)->proc_rank;
        if ((iVar2 != iVar3) && (1 < *(int *)((long)&pWVar10->proc_rank + lVar11))) {
          iVar4 = *(int *)((long)pWVar10 + lVar11 + -0xc);
          __position._M_current = *(MoveInfo **)(local_38 + 8);
          local_64.move_gid = iVar4;
          local_64.src_proc = iVar2;
          local_64.dst_proc = iVar3;
          if (__position._M_current == *(MoveInfo **)(local_38 + 0x10)) {
            std::vector<diy::detail::MoveInfo,std::allocator<diy::detail::MoveInfo>>::
            _M_realloc_insert<diy::detail::MoveInfo_const&>(local_38,__position,&local_64);
          }
          else {
            (__position._M_current)->dst_proc = iVar3;
            (__position._M_current)->move_gid = iVar4;
            (__position._M_current)->src_proc = iVar2;
            *(long *)(local_38 + 8) = *(long *)(local_38 + 8) + 0xc;
          }
          local_88.super__Vector_base<diy::detail::WorkInfo,_std::allocator<diy::detail::WorkInfo>_>
          ._M_impl.super__Vector_impl_data._M_start =
               *(pointer *)
                local_58.c.
                super__Vector_base<diy::detail::WorkInfo,_std::allocator<diy::detail::WorkInfo>_>.
                _M_impl.super__Vector_impl_data._M_start;
          uVar6 = (local_58.c.
                   super__Vector_base<diy::detail::WorkInfo,_std::allocator<diy::detail::WorkInfo>_>
                   ._M_impl.super__Vector_impl_data._M_start)->top_work;
          uVar7 = (local_58.c.
                   super__Vector_base<diy::detail::WorkInfo,_std::allocator<diy::detail::WorkInfo>_>
                   ._M_impl.super__Vector_impl_data._M_start)->proc_work;
          local_88.super__Vector_base<diy::detail::WorkInfo,_std::allocator<diy::detail::WorkInfo>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage =
               (pointer)CONCAT44(local_88.
                                 super__Vector_base<diy::detail::WorkInfo,_std::allocator<diy::detail::WorkInfo>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                                 (local_58.c.
                                  super__Vector_base<diy::detail::WorkInfo,_std::allocator<diy::detail::WorkInfo>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->nlids);
          uVar8 = uVar6;
          if ((uint)uVar6 < uVar1) {
            local_88.
            super__Vector_base<diy::detail::WorkInfo,_std::allocator<diy::detail::WorkInfo>_>.
            _M_impl.super__Vector_impl_data._M_start =
                 (pointer)CONCAT44(iVar4,(int)local_88.
                                              super__Vector_base<diy::detail::WorkInfo,_std::allocator<diy::detail::WorkInfo>_>
                                              ._M_impl.super__Vector_impl_data._M_start);
            uVar8 = uVar1;
          }
          local_88.super__Vector_base<diy::detail::WorkInfo,_std::allocator<diy::detail::WorkInfo>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)CONCAT44(uVar7 + uVar1,uVar8);
          Catch::clara::std::
          priority_queue<diy::detail::WorkInfo,_std::vector<diy::detail::WorkInfo,_std::allocator<diy::detail::WorkInfo>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/detail/algorithms/load-balance-collective.hpp:34:16)>
          ::pop(&local_58);
          Catch::clara::std::
          priority_queue<diy::detail::WorkInfo,_std::vector<diy::detail::WorkInfo,_std::allocator<diy::detail::WorkInfo>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/detail/algorithms/load-balance-collective.hpp:34:16)>
          ::push(&local_58,(value_type *)&local_88);
        }
      }
      uVar9 = uVar9 + 1;
      pWVar10 = (all_work_info->
                super__Vector_base<diy::detail::WorkInfo,_std::allocator<diy::detail::WorkInfo>_>).
                _M_impl.super__Vector_impl_data._M_start;
      uVar12 = ((long)(all_work_info->
                      super__Vector_base<diy::detail::WorkInfo,_std::allocator<diy::detail::WorkInfo>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pWVar10 >> 2) *
               -0x3333333333333333;
      lVar11 = lVar11 + 0x14;
    } while (uVar9 <= uVar12 && uVar12 - uVar9 != 0);
  }
  if (local_58.c.super__Vector_base<diy::detail::WorkInfo,_std::allocator<diy::detail::WorkInfo>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.c.
                    super__Vector_base<diy::detail::WorkInfo,_std::allocator<diy::detail::WorkInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_58.c.
                          super__Vector_base<diy::detail::WorkInfo,_std::allocator<diy::detail::WorkInfo>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.c.
                          super__Vector_base<diy::detail::WorkInfo,_std::allocator<diy::detail::WorkInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

inline void decide_move_info(std::vector<WorkInfo>&        all_work_info,          // global work info
                      std::vector<MoveInfo>&        all_move_info)          // (output) move info for all moves
{
    all_move_info.clear();

    // move all blocks with an approximation to the longest processing time first (LPTF) scheduling algorithm
    // https://en.wikipedia.org/wiki/Longest-processing-time-first_scheduling
    // we iteratively move the heaviest block to lightest proc
    // constrained by only recording the heaviest block for each proc, not all blocks

    // minimum proc_work priority queue, top is min proc_work
    auto cmp = [&](WorkInfo& a, WorkInfo& b) { return a.proc_work > b.proc_work; };
    std::priority_queue<WorkInfo, std::vector<WorkInfo>, decltype(cmp)> min_proc_work_q(cmp);
    for (auto i = 0; i < all_work_info.size(); i++)
        min_proc_work_q.push(all_work_info[i]);

    // sort all_work_info by descending top_work
    std::sort(all_work_info.begin(), all_work_info.end(),
            [&](WorkInfo& a, WorkInfo& b) { return a.top_work > b.top_work; });

    // walk the all_work_info vector in descending top_work order
    // move the next heaviest block to the lightest proc
    for (auto i = 0; i < all_work_info.size(); i++)
    {
        auto src_work_info = all_work_info[i];                      // heaviest block
        auto dst_work_info = min_proc_work_q.top();                 // lightest proc

        // sanity check that the move makes sense
        if (src_work_info.proc_work - dst_work_info.proc_work > src_work_info.top_work &&   // improve load balance
                src_work_info.proc_rank != dst_work_info.proc_rank &&                       // not self
                src_work_info.nlids > 1)                                                    // don't leave a proc with no blocks
        {
            MoveInfo move_info;
            move_info.src_proc  = src_work_info.proc_rank;
            move_info.dst_proc  = dst_work_info.proc_rank;
            move_info.move_gid  = src_work_info.top_gid;
            all_move_info.push_back(move_info);

            // update the min_proc_work priority queue
            auto work_info = min_proc_work_q.top();                 // lightest proc
            work_info.proc_work += src_work_info.top_work;
            if (work_info.top_work < src_work_info.top_work)
            {
                work_info.top_work = src_work_info.top_work;
                work_info.top_gid  = src_work_info.top_gid;
            }
            min_proc_work_q.pop();
            min_proc_work_q.push(work_info);
        }
    }
}